

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.cpp
# Opt level: O0

bool ReadDSK(MemFile *file,shared_ptr<Disk> *disk)

{
  Encoding encoding_;
  DataRate datarate_;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong extraout_RAX;
  ulong uVar7;
  exception *peVar8;
  uint8_t *puVar9;
  element_type *peVar10;
  mapped_type *pmVar11;
  reference pvVar12;
  Sector *this;
  ssize_t sVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar14;
  uchar *puVar15;
  const_iterator it;
  const_iterator itEnd;
  size_t in_RCX;
  size_t __nbytes;
  char *pcVar16;
  uint local_5b8;
  DataRate local_55c;
  uint local_4d0;
  uchar *pbTail;
  size_t uTail;
  EDSK_HEADER **local_468;
  EDSK_TRACK *pth;
  MemFile *local_458;
  function<void_(const_CylHead_&)> local_450;
  Range local_42c;
  undefined1 local_41b [8];
  EDSK_OFFSETS eo;
  int local_3fc;
  char *local_3f8;
  uint local_3ec;
  char *pcStack_3e8;
  int uTrackEnd;
  Merge local_3dc;
  char *pcStack_3d8;
  Merge res;
  undefined4 local_3cc;
  char *local_3c8;
  byte local_3bc;
  byte local_3bb;
  byte local_3ba;
  allocator<char> local_3b9;
  key_type local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  allocator<unsigned_char> local_371;
  undefined1 local_370 [8];
  Data data;
  int u;
  int num_copies;
  int data_size;
  int native_size;
  char *local_340;
  char *local_338;
  byte local_32e;
  byte local_32d;
  byte local_32c;
  byte local_32b;
  byte local_32a;
  byte local_329;
  undefined1 local_328 [2];
  bool deleted_dam;
  bool data_crc_error;
  bool data_not_found;
  bool id_crc_error;
  uint8_t status2;
  uint8_t status1;
  undefined1 local_318 [8];
  Sector sector;
  EDSK_SECTOR *ps;
  char *pcStack_2c8;
  uint8_t sec;
  int local_2c0;
  uint local_2bc;
  int uMinimum;
  int uSectorHeaders;
  Track track;
  Encoding encoding;
  DataRate datarate;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 local_258 [8];
  EDSK_TRACK th;
  char *local_220;
  Track local_218;
  uint local_1f4;
  int local_1f0;
  int uTrackSize;
  int uTrackStart;
  CylHead cylhead;
  uint8_t head;
  uint8_t cyl;
  bool fWarned6K;
  MEMORY mem;
  key_type local_1c0;
  allocator local_199;
  string local_198;
  string local_178;
  byte local_143;
  byte local_142;
  byte local_141;
  uint8_t heads;
  uint8_t cyls;
  ulong uStack_140;
  bool fEDSK;
  unsigned_long max_cyls;
  uint8_t *pbIndex;
  EDSK_HEADER *peh;
  uint8_t ab [256];
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_RAX & 1) == 0) ||
     (uVar7 = MemFile::read(file,(int)&peh,(void *)0x100,in_RCX), (uVar7 & 1) == 0)) {
    file_local._7_1_ = false;
  }
  else {
    pbIndex = (uint8_t *)&peh;
    if ((CONCAT71(peh._1_7_,(char)peh) == 0x4445444e45545845) ||
       (CONCAT71(peh._1_7_,(char)peh) == 0x435043202d20564d)) {
      max_cyls = (unsigned_long)(ab + 0x2c);
      uStack_140 = 0x66;
      local_141 = (char)peh == 'E';
      if ((ab[0x29] & 0x80) != 0) {
        Message<>(msgWarning,"ignoring deprecated \'random data errors\' flag");
        pbIndex[0x31] = pbIndex[0x31] & 0x7f;
      }
      local_142 = pbIndex[0x30];
      local_143 = pbIndex[0x31];
      if (2 < local_143) {
        peVar8 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[21],unsigned_char&,char_const(&)[2]>
                  (peVar8,(char (*) [21])"invalid head count (",&local_143,(char (*) [2])0x2a8e34);
        __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
      }
      if ((0x80 < local_142) || (uStack_140 < local_142)) {
        peVar8 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[25],unsigned_char&,char_const(&)[2]>
                  (peVar8,(char (*) [25])"invalid cylinder count (",&local_142,
                   (char (*) [2])0x2a8e34);
        __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
      }
      puVar9 = pbIndex + 0x22;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,(char *)puVar9,0xe,&local_199);
      util::trim(&local_178,&local_198);
      peVar10 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           disk);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"creator",(allocator<char> *)((long)&mem.pb + 7));
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar10->metadata,&local_1c0);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&mem.pb + 7));
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      MEMORY::MEMORY((MEMORY *)&cylhead.head,0xff00);
      cylhead.cyl._3_1_ = 0;
      for (cylhead.cyl._2_1_ = 0; cylhead.cyl._2_1_ < local_142;
          cylhead.cyl._2_1_ = cylhead.cyl._2_1_ + 1) {
        for (cylhead.cyl._1_1_ = 0; cylhead.cyl._1_1_ < local_143;
            cylhead.cyl._1_1_ = cylhead.cyl._1_1_ + 1) {
          CylHead::CylHead((CylHead *)&uTrackSize,(uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_);
          local_1f0 = MemFile::tell(file);
          if ((local_141 & 1) == 0) {
            __nbytes = (size_t)(byte)*(ushort *)(pbIndex + 0x32);
            local_4d0 = (uint)*(ushort *)(pbIndex + 0x32);
          }
          else {
            __nbytes = (size_t)(int)((uint)cylhead.cyl._2_1_ * (uint)local_143 +
                                    (uint)cylhead.cyl._1_1_);
            local_4d0 = (uint)*(byte *)(max_cyls + __nbytes) << 8;
          }
          local_1f4 = local_4d0;
          if (((local_141 & 1) == 0) || (local_4d0 != 0)) {
            if (0x27 < cylhead.cyl._2_1_) {
              uVar3 = MemFile::tell(file);
              uVar4 = MemFile::size(file);
              __nbytes = (size_t)uVar4;
              if (uVar3 == uVar4) {
                local_220 = CH((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_);
                Message<char_const*>
                          (msgWarning,"%s track header is missing, assuming blank track",&local_220)
                ;
                peVar10 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                          operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)disk);
                Track::Track((Track *)&th.track,0);
                Disk::write(peVar10,(int)&uTrackSize,&th.track,__nbytes);
                Track::~Track((Track *)&th.track);
                goto LAB_0026d84d;
              }
            }
            uVar7 = MemFile::read(file,(int)local_258,(void *)0x18,__nbytes);
            if ((uVar7 & 1) == 0) {
              peVar8 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[20],CylHead&>
                        (peVar8,(char (*) [20])"short file reading ",(CylHead *)&uTrackSize);
              __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
            }
            iVar5 = memcmp(local_258,"Track-Info\r\n",10);
            if (iVar5 != 0) {
              peVar8 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[28],CylHead&>
                        (peVar8,(char (*) [28])"track signature missing on ",(CylHead *)&uTrackSize)
              ;
              __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
            }
            if (((local_141 & 1) == 0) && (7 < (byte)th.signature[0xc])) {
              local_260 = SizeStr((uint)(byte)th.signature[0xc]);
              local_268 = CH((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_);
              Message<char_const*,char_const*>
                        (msgWarning,"invalid sector size code (%s) on %s",&local_260,&local_268);
            }
            if ((th.signature[8] != cylhead.cyl._2_1_) ||
               (pcVar16 = (char *)(ulong)cylhead.cyl._1_1_, th.signature[9] != cylhead.cyl._1_1_)) {
              if (th.signature[8] == cylhead.cyl._2_1_) {
                local_280 = HeadStr((uint)(byte)th.signature[9]);
                local_288 = HeadStr((uint)cylhead.cyl._1_1_);
                pcVar16 = (char *)&local_288;
                Message<char_const*,char_const*>
                          (msgWarning,"header side %s != head %s",&local_280,(char **)pcVar16);
              }
              else {
                local_270 = CylStr((uint)(byte)th.signature[8]);
                local_278 = CylStr((uint)cylhead.cyl._2_1_);
                pcVar16 = (char *)&local_278;
                Message<char_const*,char_const*>
                          (msgWarning,"header track %s != cyl %s",&local_270,(char **)pcVar16);
              }
            }
            if ((th.signature[10] == '\0') && (th.signature[5] != '\0')) {
              th.signature[10] = th.signature[5];
              th.signature[5] = '\0';
            }
            if ((th.signature[0xb] == '\0') && (th.signature[6] != '\0')) {
              th.signature[0xb] = th.signature[6];
              th.signature[6] = '\0';
            }
            if (((th.signature[5] != '\0') || (th.signature[6] != '\0')) ||
               (th.signature[7] != '\0')) {
              pcVar16 = th.signature + 6;
              _encoding = CH((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_);
              Message<unsigned_char&,unsigned_char&,unsigned_char&,char_const*>
                        (msgWarning,"unused fields are non-zero (%02X %02X %02X) on %s",
                         (uchar *)(th.signature + 5),(uchar *)pcVar16,(uchar *)(th.signature + 7),
                         (char **)&encoding);
            }
            if ((th.signature[10] == '\0') || (3 < (byte)th.signature[10])) {
              local_55c = _250K;
            }
            else {
              pcVar16 = (char *)(ulong)(byte)th.signature[10];
              local_55c = ReadDSK::abEDSKRates[(long)pcVar16];
            }
            track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = local_55c;
            track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = (th.signature[0xb] == '\x01') + MFM;
            Track::Track((Track *)&uMinimum,(uint)th.unused[0]);
            local_2bc = ((uint)th.unused[0] * 8 + 0x117 & 0xffffff00) - 0x18;
            local_2c0 = (uint)th.unused[0] << 3;
            if (local_2c0 < (int)local_2bc) {
              iVar5 = MemFile::size(file);
              uVar3 = MemFile::tell(file);
              pcVar16 = (char *)(ulong)uVar3;
              if (iVar5 - uVar3 != local_2c0) goto LAB_0026ca24;
              pcStack_2c8 = CH((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_);
              Message<char_const*>
                        (msgWarning,"%s track header is shorter than index size",
                         &stack0xfffffffffffffd38);
            }
            else {
LAB_0026ca24:
              puVar9 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&cylhead.head);
              uVar7 = MemFile::read(file,(int)puVar9,(void *)(ulong)local_2bc,(size_t)pcVar16);
              if ((uVar7 & 1) == 0) {
                peVar8 = (exception *)__cxa_allocate_exception(0x10);
                util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[16]>
                          (peVar8,(char (*) [20])"short file reading ",(CylHead *)&uTrackSize,
                           (char (*) [16])" sector headers");
                __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
              }
            }
            for (ps._7_1_ = 0;
                datarate_ = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                encoding_ = (Encoding)
                            track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                pcVar16 = (char *)(ulong)th.unused[0], ps._7_1_ < th.unused[0];
                ps._7_1_ = ps._7_1_ + 1) {
              sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)(mem._8_8_ + (ulong)ps._7_1_ * 8)
              ;
              Header::Header((Header *)local_328,
                             (uint)*(byte *)&((sector.m_data.
                                               super__Vector_base<Data,_std::allocator<Data>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                             ).
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                             (uint)*(byte *)((long)&((sector.m_data.
                                                                                                            
                                                  super__Vector_base<Data,_std::allocator<Data>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ->
                                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ).
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1),
                             (uint)*(byte *)((long)&((sector.m_data.
                                                                                                            
                                                  super__Vector_base<Data,_std::allocator<Data>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ->
                                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ).
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2),
                             (uint)*(byte *)((long)&((sector.m_data.
                                                                                                            
                                                  super__Vector_base<Data,_std::allocator<Data>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ->
                                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ).
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 3));
              Sector::Sector((Sector *)local_318,datarate_,encoding_,(Header *)local_328,0);
              if (((int)(uint)ps._7_1_ < (int)(th.unused[0] - 1)) &&
                 ((sector.encoding = (Encoding)th.unused[1], sector.encoding == 0x4e ||
                  (sector.encoding == 0x52)))) {
                sector.encoding = Unknown;
              }
              local_329 = *(byte *)((long)&((sector.m_data.
                                             super__Vector_base<Data,_std::allocator<Data>_>._M_impl
                                             .super__Vector_impl_data._M_end_of_storage)->
                                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                           ).
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4);
              local_32a = *(byte *)((long)&((sector.m_data.
                                             super__Vector_base<Data,_std::allocator<Data>_>._M_impl
                                             .super__Vector_impl_data._M_end_of_storage)->
                                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                           ).
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 5);
              local_32b = (local_329 & 0x20) != 0;
              local_32c = (local_32a & 1) != 0;
              local_32d = (local_32a & 0x20) != 0;
              local_32e = (local_32a & 0x40) != 0;
              if ((bool)local_32d) {
                local_32b = 0;
              }
              else if ((bool)local_32b) {
                Sector::set_badidcrc((Sector *)local_318,true);
              }
              if (((local_329 & 0x20) != 0) && ((local_32a & 1) != 0)) {
                local_338 = CHSR((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_,(uint)ps._7_1_,
                                 sector.header.cyl);
                Message<char_const*>(msgWarning,"unsupported placeholder sector on %s",&local_338);
                local_32a = local_32a & 0xfe;
              }
              if (((local_329 & 0x4a) != 0) || ((local_32a & 0x8c) != 0)) {
                local_340 = CHSR((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_,(uint)ps._7_1_,
                                 sector.header.cyl);
                Message<unsigned_char&,unsigned_char&,char_const*>
                          (msgWarning,"invalid status (ST1=%02X ST2=%02X) for %s",&local_329,
                           &local_32a,&local_340);
                local_329 = local_329 & 0xb5;
                local_32a = local_32a & 0x73;
              }
              if ((((((local_329 != 0) || (local_32a != 0)) &&
                    ((local_329 != 0 || (local_32a != 0x40)))) &&
                   ((local_329 != 0x80 || (local_32a != 0)))) &&
                  (((local_329 != 0x20 || (local_32a != 0)) &&
                   ((((local_329 != 0x20 || (local_32a != 0x20)) &&
                     ((local_329 != 0x20 || (local_32a != 0x60)))) &&
                    ((local_329 != 1 || (local_32a != 1)))))))) &&
                 (((local_329 != 0 || (local_32a != 1)) &&
                  (((local_329 != 4 || (local_32a != 0)) &&
                   ((local_329 != 4 || (local_32a != 0x10)))))))) {
                _data_size = CHSR((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_,(uint)ps._7_1_,
                                  sector.header.cyl);
                Message<unsigned_char&,unsigned_char&,char_const*>
                          (msgWarning,"unusual status flags (ST1=%02X ST2=%02X) for %s",&local_329,
                           &local_32a,(char **)&data_size);
              }
              iVar5 = Sector::size((Sector *)local_318);
              if ((local_141 & 1) == 0) {
                local_5b8 = Sector::SizeCodeToLength((uint)(byte)th.signature[0xc]);
              }
              else {
                local_5b8 = (uint)*(ushort *)
                                   ((long)&((sector.m_data.
                                             super__Vector_base<Data,_std::allocator<Data>_>._M_impl
                                             .super__Vector_impl_data._M_end_of_storage)->
                                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                           ).
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 6);
              }
              u = local_5b8;
              data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)((local_32c & 1) == 0);
              if (((((local_141 & 1) != 0) && (iVar5 < (int)local_5b8)) && ((local_32d & 1) != 0))
                 && (((int)local_5b8 % iVar5 == 0 || (local_5b8 == 0xc000)))) {
                if (local_5b8 == 0xc000) {
                  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
                }
                else {
                  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ = (int)local_5b8 / iVar5;
                }
                u = (int)local_5b8 /
                    (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_;
              }
              for (data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage <
                  (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_;
                  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_4_ =
                       (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
                std::allocator<unsigned_char>::allocator(&local_371);
                Data::vector((Data *)local_370,(long)u,&local_371);
                std::allocator<unsigned_char>::~allocator(&local_371);
                bVar1 = MemFile::read<Data>(file,(Data *)local_370);
                if (!bVar1) {
                  peVar8 = (exception *)__cxa_allocate_exception(0x10);
                  util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[9],int&>
                            (peVar8,(char (*) [20])"short file reading ",(CylHead *)&uTrackSize,
                             (char (*) [9])0x2ab23d,(int *)&sector);
                  __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
                }
                local_3ba = 0;
                local_3bb = 0;
                local_3bc = 0;
                bVar1 = false;
                if (opt.fix != 0) {
                  peVar10 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)disk);
                  std::allocator<char>::allocator();
                  local_3ba = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3b8,"creator",&local_3b9);
                  local_3bb = 1;
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&peVar10->metadata,&local_3b8);
                  std::__cxx11::string::substr((ulong)&local_398,(ulong)pmVar11);
                  local_3bc = 1;
                  bVar2 = std::operator==(&local_398,"CPD");
                  bVar1 = false;
                  if (((bVar2) && (bVar1 = false, iVar5 < u)) &&
                     (bVar1 = false, (local_32d & 1) == 0)) {
                    bVar1 = u % iVar5 == 0;
                  }
                }
                if ((local_3bc & 1) != 0) {
                  std::__cxx11::string::~string((string *)&local_398);
                }
                if ((local_3bb & 1) != 0) {
                  std::__cxx11::string::~string((string *)&local_3b8);
                }
                if ((local_3ba & 1) != 0) {
                  std::allocator<char>::~allocator(&local_3b9);
                }
                if (bVar1) {
                  local_3c8 = CHSR((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_,(uint)ps._7_1_,
                                   sector.header.cyl);
                  Message<char_const*>(msgFix,"dropping suspicious excess data on %s",&local_3c8);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_370,
                             (long)iVar5);
                }
                if ((((local_32d & 1) != 0) && (u % iVar5 == 1)) &&
                   (pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_370,(long)(u + -1)), *pvVar12 == '{')) {
                  u = u + -1;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_370,
                             (long)u);
                }
                if ((local_141 & 1) == 0) {
                  if (((local_32b & 1) == 0) && ((local_32c & 1) == 0)) {
                    if (iVar5 < u) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_370,
                                 (long)u);
                    }
                    goto LAB_0026d4a9;
                  }
                  local_3cc = 0xd;
                }
                else {
LAB_0026d4a9:
                  if (((local_32b & 1) == 0) && ((local_32c & 1) == 0)) {
                    local_3dc = Sector::add((Sector *)local_318,(Data *)local_370,
                                            (bool)(local_32d & 1),(~local_32e & 1) * '\x03' + 0xf8);
                    if (local_3dc == Unchanged) {
                      pcStack_3e8 = CHSR((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_,
                                         (uint)ps._7_1_,sector.header.cyl);
                      Message<char_const*>
                                (msgInfo,"ignored identical data copy of %s",
                                 &stack0xfffffffffffffc18);
                    }
                  }
                  else {
                    pcStack_3d8 = CHSR((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_,
                                       (uint)ps._7_1_,sector.header.cyl);
                    Message<char_const*>
                              (msgWarning,"ignoring stored data on %s, which has no data field",
                               &stack0xfffffffffffffc28);
                  }
                  local_3cc = 0;
                }
                Data::~Data((Data *)local_370);
              }
              Track::add((Track *)&uMinimum,(Sector *)local_318);
              Sector::~Sector((Sector *)local_318);
            }
            iVar5 = MemFile::tell(file);
            local_3ec = iVar5 + 0xffU & 0xffffff00;
            MemFile::seek(file,local_1f0 + local_1f4);
            if (((local_141 & 1) != 0) && (local_3ec - local_1f0 != local_1f4)) {
              if ((local_3ec - local_1f0 & 0xffff) == local_1f4) {
                register0x00000000 = CH((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_);
                eo.signature._7_4_ = local_3ec - local_1f0;
                pcVar16 = eo.signature + 7;
                Message<char_const*,int,int&>
                          (msgWarning,"%s size (%u) does not match index entry (%u)",
                           (char **)(eo.signature + 0xb),(int *)pcVar16,(int *)&local_1f4);
                MemFile::seek(file,local_3ec);
              }
              else {
                local_3f8 = CH((uint)cylhead.cyl._2_1_,(uint)cylhead.cyl._1_1_);
                local_3fc = local_3ec - local_1f0;
                pcVar16 = (char *)&local_3fc;
                Message<char_const*,int,int&>
                          (msgWarning,"%s size (%u) does not match index entry (%u)",&local_3f8,
                           (int *)pcVar16,(int *)&local_1f4);
              }
            }
            if (((cylhead.cyl._3_1_ & 1) == 0) &&
               (bVar1 = Track::is_8k_sector((Track *)&uMinimum), bVar1)) {
              this = Track::operator[]((Track *)&uMinimum,0);
              iVar5 = Sector::data_size(this);
              if (iVar5 == 0x1800) {
                Message<>(msgWarning,"missing checksums needed to verify 8K sector integrity");
                cylhead.cyl._3_1_ = 1;
              }
            }
            peVar10 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)disk);
            Disk::write(peVar10,(int)&uTrackSize,&uMinimum,(size_t)pcVar16);
            Track::~Track((Track *)&uMinimum);
          }
          else {
            peVar10 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)disk);
            Track::Track(&local_218,0);
            Disk::write(peVar10,(int)&uTrackSize,&local_218,__nbytes);
            Track::~Track(&local_218);
          }
LAB_0026d84d:
        }
      }
      if (((local_141 & 1) != 0) &&
         (sVar13 = MemFile::read(file,(int)local_41b,(void *)0xf,1), (int)sVar13 != 0)) {
        iVar5 = memcmp(local_41b,"Offset-Info\r\n",0xb);
        if (iVar5 == 0) {
          Range::Range(&local_42c,(uint)local_142,(uint)local_143);
          pth = (EDSK_TRACK *)disk;
          local_458 = file;
          std::function<void(CylHead_const&)>::
          function<ReadDSK(MemFile&,std::shared_ptr<Disk>&)::__0,void>
                    ((function<void(CylHead_const&)> *)&local_450,(anon_class_16_2_3eff0018 *)&pth);
          Range::each(&local_42c,&local_450,false);
          std::function<void_(const_CylHead_&)>::~function(&local_450);
        }
        else {
          iVar5 = MemFile::tell(file);
          MemFile::seek(file,iVar5 + -0xf);
        }
      }
      local_468 = &peh;
      while (sVar13 = MemFile::read(file,(int)&peh,(void *)0x100,1), (int)sVar13 != 0) {
        iVar5 = memcmp(local_468,"Track-Info\r\n",10);
        if ((iVar5 != 0) || (*(char *)((long)local_468 + 0x15) != '\0')) {
          iVar5 = MemFile::tell(file);
          MemFile::seek(file,iVar5 + -0x100);
          break;
        }
        uTail = (size_t)CH((uint)*(byte *)(local_468 + 2),(uint)*(byte *)((long)local_468 + 0x11));
        Message<char_const*>(msgWarning,"blank %s should not have EDSK track block",(char **)&uTail)
        ;
      }
      iVar5 = MemFile::size(file);
      iVar6 = MemFile::tell(file);
      pbTail = (uchar *)(long)(iVar5 - iVar6);
      if (pbTail != (uchar *)0x0) {
        pvVar14 = &MemFile::data(file)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        puVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar14);
        iVar5 = MemFile::tell(file);
        puVar15 = puVar15 + iVar5;
        iVar5 = memcmp(puVar15,puVar15 + 1,(size_t)(pbTail + -1));
        if (iVar5 == 0) {
          Message<unsigned_long&,unsigned_char_const&>
                    (msgWarning,"file ends with %u bytes of %02X filler",(unsigned_long *)&pbTail,
                     puVar15);
        }
        else {
          Message<unsigned_long&>
                    (msgWarning,"%u bytes of unused data found at end of file:",
                     (unsigned_long *)&pbTail);
          pvVar14 = &MemFile::data(file)->
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          it = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar14);
          pvVar14 = &MemFile::data(file)->
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          itEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar14);
          iVar5 = MemFile::tell(file);
          util::
          hex_dump<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )it._M_current,
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )itEnd._M_current,iVar5,(colour *)0x0,0x10);
        }
      }
      peVar10 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           disk);
      std::__cxx11::string::operator=((string *)&peVar10->strType,"EDSK");
      file_local._7_1_ = true;
      local_3cc = 1;
      MEMORY::~MEMORY((MEMORY *)&cylhead.head);
    }
    else {
      file_local._7_1_ = false;
    }
  }
  return file_local._7_1_;
}

Assistant:

bool ReadDSK(MemFile& file, std::shared_ptr<Disk>& disk)
{
    uint8_t ab[256];
    if (!file.rewind() || !file.read(&ab, sizeof(ab)))
        return false;

    auto peh = reinterpret_cast<EDSK_HEADER*>(ab);
    if (memcmp(peh->szSignature, EDSK_SIGNATURE, 8) &&  // match: "EXTENDED" only
        memcmp(peh->szSignature, DSK_SIGNATURE, 8)) // match: "MV - CPC"
        return false;

    auto pbIndex = reinterpret_cast<const uint8_t*>(peh + 1);
    auto max_cyls = (sizeof(ab) - sizeof(EDSK_HEADER)) / MAX_SIDES;
    bool fEDSK = peh->szSignature[0] == EDSK_SIGNATURE[0];

    // Warn if the deprecated 'random data errors' flag is set
    if (peh->bSides & 0x80)
    {
        Message(msgWarning, "ignoring deprecated 'random data errors' flag");
        peh->bSides &= ~0x80;
    }

    uint8_t cyls = peh->bTracks;
    uint8_t heads = peh->bSides;

    if (heads > MAX_SIDES)
        throw util::exception("invalid head count (", heads, ")");
    else if (cyls > MAX_TRACKS || cyls > max_cyls)
        throw util::exception("invalid cylinder count (", cyls, ")");

    disk->metadata["creator"] = util::trim(std::string(peh->szCreator, sizeof(peh->szCreator)));

    MEMORY mem(ESDK_MAX_TRACK_SIZE);
    bool fWarned6K = false;

    for (uint8_t cyl = 0; cyl < cyls; ++cyl)
    {
        for (uint8_t head = 0; head < heads; ++head)
        {
            CylHead cylhead(cyl, head);
            static const DataRate abEDSKRates[] = { DataRate::_250K, DataRate::_250K, DataRate::_500K, DataRate::_1M };

            // Remember the start position
            auto uTrackStart = file.tell();

            // EDSK supports variable track size, DSK has it fixed for the entire image
            auto uTrackSize = fEDSK ? (pbIndex[cyl * heads + head] << 8) : ((peh->abTrackSize[1] << 8) | peh->abTrackSize[0]);

            // EDSK doesn't store blank tracks, as indicated by zero size in the index
            if (fEDSK && !uTrackSize)
            {
                disk->write(cylhead, Track());
                continue;
            }

            // SugarBox (<= 0.22) doesn't write blank tracks at the end of the disk.
            if (cyl >= 40 && file.tell() == file.size())
            {
                Message(msgWarning, "%s track header is missing, assuming blank track", CH(cyl, head));
                disk->write(cylhead, Track());
                continue;
            }

            EDSK_TRACK th;
            if (!file.read(&th, sizeof(th)))
                throw util::exception("short file reading ", cylhead);

            // Check for "Track-Info", tolerating \r\n missing in bad images (Addams Family)
            if (memcmp(th.signature, EDSK_TRACK_SIG, 10))
                throw util::exception("track signature missing on ", cylhead);

            // Warn if the track sector size is invalid
            if (!fEDSK && th.size > SIZE_MASK_765)
                Message(msgWarning, "invalid sector size code (%s) on %s", SizeStr(th.size), CH(cyl, head));

            if (th.track != cyl || th.side != head)
            {
                if (th.track != cyl) Message(msgWarning, "header track %s != cyl %s", CylStr(th.track), CylStr(cyl));
                else Message(msgWarning, "header side %s != head %s", HeadStr(th.side), HeadStr(head));
            }

            // SAMdisk initially implemented John Elliot's rate+encoding extension in the wrong place.
            // If we find values in the wrong place, and none set in the right place, move them over!
            if (th.rate == 0 && th.unused[0]) { th.rate = th.unused[0]; th.unused[0] = 0; }
            if (th.encoding == 0 && th.unused[1]) { th.encoding = th.unused[1]; th.unused[1] = 0; }

            // Warn if the unused fields are used
            if (th.unused[0] || th.unused[1] || th.unused[2])
                Message(msgWarning, "unused fields are non-zero (%02X %02X %02X) on %s", th.unused[0], th.unused[1], th.unused[2], CH(cyl, head));

            DataRate datarate = (th.rate >= 1 && th.rate <= 3) ? abEDSKRates[th.rate] : DataRate::_250K;
            Encoding encoding = (th.encoding != 1) ? Encoding::MFM : Encoding::FM;
            Track track(th.sectors);

            // Determine the track header size, and the start of the data beyond it
            // Round the header size to the next 256-byte boundary
            int uSectorHeaders = (sizeof(EDSK_TRACK) + th.sectors * sizeof(EDSK_SECTOR) + 0xff) & ~0xff;
            uSectorHeaders -= sizeof(EDSK_TRACK);
            int uMinimum = th.sectors * sizeof(EDSK_SECTOR);

            // CPCDiskXP writes a truncated track header if the final track is blank.
            // Check if only the minimum header size has been supplied.
            if (uMinimum < uSectorHeaders && (file.size() - file.tell()) == uMinimum)
                Message(msgWarning, "%s track header is shorter than index size", CH(cyl, head));
            else if (!file.read(mem, uSectorHeaders))
                throw util::exception("short file reading ", cylhead, " sector headers");

            for (uint8_t sec = 0; sec < th.sectors; ++sec)
            {
                auto ps = &reinterpret_cast<EDSK_SECTOR*>(mem.pb)[sec];
                Sector sector(datarate, encoding, Header(ps->track, ps->side, ps->sector, ps->size));

                // Set gap3 on all but final setor
                if (sec < th.sectors - 1)
                {
                    sector.gap3 = th.gap3;

                    // If the sector uses a default gap3 size, clear it. This allows overrides by stored gap3
                    // in ALLGAPS images, and also prevents the default value showing up in track scans.
                    // If the same image is written back, any unset gap3 will be restored to the same value.
                    if (sector.gap3 == EDSK_DEFAULT_GAP3 || sector.gap3 == CPC_DEFAULT_GAP3)
                        sector.gap3 = 0;
                }

                uint8_t status1 = ps->status1, status2 = ps->status2;
                bool id_crc_error = (status1 & SR1_CRC_ERROR) != 0;
                bool data_not_found = (status2 & SR2_MISSING_ADDRESS_MARK) != 0;
                bool data_crc_error = (status2 & SR2_CRC_ERROR_IN_SECTOR_DATA) != 0;
                bool deleted_dam = (status2 & SR2_SECTOR_WITH_DELETED_DATA) != 0;

                // uPD765 sets both id and data flags for data CRC errors
                if (data_crc_error)
                    id_crc_error = false;
                else if (id_crc_error)
                    sector.set_badidcrc();

                // Check for an impossible flag combo, used for storing placeholder sectors (Logo Professor test)
                if (status1 & SR1_CRC_ERROR && status2 & SR2_MISSING_ADDRESS_MARK)
                {
                    Message(msgWarning, "unsupported placeholder sector on %s", CHSR(cyl, head, sec, sector.header.sector));
                    status2 &= ~SR2_MISSING_ADDRESS_MARK;
                }

                // Check for bits that shouldn't be set in the status bytes
                if ((status1 & (SR1_WRITE_PROTECT_DETECTED | SR1_RESERVED1 | SR1_RESERVED2)) ||
                    (status2 & (SR2_SCAN_COMMAND_FAILED | SR2_SCAN_COMMAND_EQUAL | SR2_RESERVED)))
                {
                    Message(msgWarning, "invalid status (ST1=%02X ST2=%02X) for %s", status1, status2, CHSR(cyl, head, sec, sector.header.sector));

                    // Clear the unexpected bits and continue
                    status1 &= ~(SR1_WRITE_PROTECT_DETECTED | SR1_RESERVED1 | SR1_RESERVED2);
                    status2 &= ~(SR2_SCAN_COMMAND_FAILED | SR2_SCAN_COMMAND_EQUAL | SR2_RESERVED);
                }

                // Match expected flag combinations, to identify unusual combinations that could indicate a bogus dump
                if (!(
                    (status1 == SR1_SUCCESS && status2 == SR2_SUCCESS) ||                   // normal data
                    (status1 == SR1_SUCCESS && status2 == SR2_SECTOR_WITH_DELETED_DATA) ||  // deleted data
                    (status1 == SR1_END_OF_CYLINDER && status2 == SR2_SUCCESS) ||                   // end of track?
                    (status1 == SR1_CRC_ERROR && status2 == SR2_SUCCESS) ||                 // id crc error
                    (status1 == SR1_CRC_ERROR && status2 == SR2_CRC_ERROR_IN_SECTOR_DATA) ||    // normal data CRC error
                    (status1 == SR1_CRC_ERROR && status2 == (SR2_CRC_ERROR_IN_SECTOR_DATA | SR2_SECTOR_WITH_DELETED_DATA)) ||   // deleted data CRC error
                    (status1 == SR1_CANNOT_FIND_ID_ADDRESS && status2 == SR2_MISSING_ADDRESS_MARK) ||       // data field missing (some FDCs set AM in ST1)
                    (status1 == SR1_SUCCESS && status2 == SR2_MISSING_ADDRESS_MARK) ||      // data field missing (some FDCs don't)
                    (status1 == SR1_CANNOT_FIND_SECTOR_ID && status2 == SR2_SUCCESS) ||                 // CHRN mismatch
                    (status1 == SR1_CANNOT_FIND_SECTOR_ID && status2 == SR2_WRONG_CYLINDER_DETECTED)        // CHRN mismatch, including wrong cylinder
                    ))
                {
                    Message(msgWarning, "unusual status flags (ST1=%02X ST2=%02X) for %s", status1, status2, CHSR(cyl, head, sec, sector.header.sector));
                }

                auto native_size = sector.size();
                auto data_size = fEDSK ? (ps->datahigh << 8) | ps->datalow : Sector::SizeCodeToLength(th.size);
                auto num_copies = data_not_found ? 0 : 1;

                // EDSK data field with gap data or multiple copies?
                if (fEDSK && data_size > native_size)
                {
                    // Multiple error copies extension?
                    // Also accept 48K as 3x16K copies, as found in early public test images.
                    if (data_crc_error && ((data_size % native_size) == 0 || data_size == 49152))
                    {
                        // Accept 48K as 3x16K, regardless of native size
                        if (data_size == 49152)
                            num_copies = 3;

                        // Otherwise it's a straight multiple
                        else
                            num_copies = data_size / native_size;

                        // Calculate the size stored for each copy
                        data_size /= num_copies;
                    }
                }

                // Process each copy
                for (auto u = 0; u < num_copies; ++u)
                {
                    // Allocate enough space for the data, with at least the native size
                    Data data(data_size);

                    // Read the data copy
                    if (!file.read(data))
                        throw util::exception("short file reading ", cylhead, " sector ", sector.header.sector);

                    // CPDRead sometimes stores too much data. If we find a data size that is an exact multiple on an
                    // error free sector, trim it down to the natural size.
                    if (opt.fix != 0 && disk->metadata["creator"].substr(0, 3) == "CPD" &&
                        data_size > native_size && !data_crc_error && !(data_size % native_size))
                    {
                        // Example: Discology +3.dsk (SDP)
                        Message(msgFix, "dropping suspicious excess data on %s", CHSR(cyl, head, sec, sector.header.sector));
                        data.resize(native_size);
                    }

                    // Data CRC, size 1 above multiple of native, and dummy marker byte at the end of the data?
                    // ToDo: document horrid hack
                    if (data_crc_error && (data_size % native_size) == 1 && data[data_size - 1] == 123)
                    {
                        // Remove the dummy byte
                        data.resize(--data_size);
                    }

                    // Old-style DSK images have some restrictions
                    if (!fEDSK)
                    {
                        // Sectors without a data field have no data
                        if (id_crc_error || data_not_found)
                            continue;

                        // Gap data is not supported
                        if (data_size > native_size)
                            data.resize(data_size);
                    }

                    if (id_crc_error || data_not_found)
                        Message(msgWarning, "ignoring stored data on %s, which has no data field", CHSR(cyl, head, sec, sector.header.sector));
                    else
                    {
                        auto res = sector.add(std::move(data), data_crc_error, deleted_dam ? 0xf8 : 0xfb);
                        if (res == Sector::Merge::Unchanged)
                            Message(msgInfo, "ignored identical data copy of %s", CHSR(cyl, head, sec, sector.header.sector));
                    }
                }

                track.add(std::move(sector));
            }

            // Calculate the used track size, rounded up to the next 256 bytes
            auto uTrackEnd = (file.tell() + 0xff) & ~0xff;

            // Seek past the size indicated by the index
            file.seek(uTrackStart + uTrackSize);

            // With EDSK images the used size should match what the index says
            if (fEDSK && (uTrackEnd - uTrackStart) != uTrackSize)
            {
                // If the low 16-bits are different, we'll stick with trusting the index size
                if (((uTrackEnd - uTrackStart) & 0xffff) != uTrackSize)
                    Message(msgWarning, "%s size (%u) does not match index entry (%u)", CH(cyl, head), uTrackEnd - uTrackStart, uTrackSize);
                else
                {
                    // The track size probably overflowed (some WinAPE images), so trust the used size
                    Message(msgWarning, "%s size (%u) does not match index entry (%u)", CH(cyl, head), uTrackEnd - uTrackStart, uTrackSize);
                    file.seek(uTrackEnd);
                }
            }

            // Legacy EDSK images only store 6K data for 8K sectors, so any
            // checksum bytes the disk may have had are lost.
            if (!fWarned6K && track.is_8k_sector() && track[0].data_size() == 6144)
            {
                Message(msgWarning, "missing checksums needed to verify 8K sector integrity");
                fWarned6K = true;
            }

            disk->write(cylhead, std::move(track));
        }
    }

    // Check for Offset-Info header at normal file end
    EDSK_OFFSETS eo;
    if (fEDSK && file.read(&eo, sizeof(eo), 1))
    {
        if (!memcmp(eo.signature, EDSK_OFFSETS_SIG, 11))
        {
            Range(cyls, heads).each([&](const CylHead& cylhead) {
                auto track = disk->read_track(cylhead);

                uint16_t val;
                if (file.read(&val, sizeof(val), 1))
                    track.tracklen = util::letoh(val) * 16; // convert to bitstream bits

                for (auto& sector : track.sectors())
                {
                    if (file.read(&val, sizeof(val), 1))
                        sector.offset = util::letoh(val) * 16;  // convert to bitstream bits
                }

                disk->write(cylhead, std::move(track));
                });
        }
        else
        {
            // Undo non-matching read
            file.seek(file.tell() - sizeof(eo));
        }
    }

    // Check for blank track headers that RealSpectrum adds to files, despite the spec saying it shouldn't:
    // "A size of "0" indicates an unformatted track. In this case there is no data, and no track
    //  information block for this track in the image file!"
    EDSK_TRACK* pth = reinterpret_cast<EDSK_TRACK*>(ab);
    while (file.read(ab, sizeof(ab), 1))
    {
        if (!memcmp(pth->signature, EDSK_TRACK_SIG, 10) && !pth->sectors)
        {
            // Example: Fun School 2 For The Over-8s.dsk (SDP +3)
            Message(msgWarning, "blank %s should not have EDSK track block", CH(pth->track, pth->side));
        }
        else
        {
            // Undo non-matching read
            file.seek(file.tell() - sizeof(ab));
            break;
        }
    }

    size_t uTail = file.size() - file.tell();
    if (uTail)
    {
        auto pbTail = file.data().data() + file.tell();

        if (!memcmp(pbTail, pbTail + 1, uTail - 1))
        {
            // Example: Compilation Disk 048 (19xx)(-).zip  (TOSEC CPC Compilations)
            Message(msgWarning, "file ends with %u bytes of %02X filler", uTail, *pbTail);
        }
        else
        {
            // Example: Silva (1985)(Lankhor)(fr)[cr Genesis][t Genesis].zip (TOSEC CPC Games)
            Message(msgWarning, "%u bytes of unused data found at end of file:", uTail);
            util::hex_dump(file.data().begin(), file.data().end(), file.tell());
        }
    }

    disk->strType = "EDSK";
    return true;
}